

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

bool __thiscall QMdi::ControlLabel::event(ControlLabel *this,QEvent *event)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  QWidget *in_RSI;
  QStyleOption *in_RDI;
  long in_FS_OFFSET;
  QStyleOptionTitleBar options;
  QEvent *in_stack_000000a8;
  QWidget *in_stack_000000b0;
  SubControl in_stack_ffffffffffffff58;
  ComplexControl in_stack_ffffffffffffff5c;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  QStyleOption *this_00;
  undefined1 local_78 [16];
  ControlLabel *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  TVar3 = QEvent::type((QEvent *)in_RSI);
  if (TVar3 == WindowIconChange) {
    updateWindowIcon(in_stack_ffffffffffffff98);
  }
  else {
    TVar3 = QEvent::type((QEvent *)in_RSI);
    if (TVar3 == StyleChange) {
      updateWindowIcon(in_stack_ffffffffffffff98);
      QPixmap::size();
      QWidget::setFixedSize(in_RSI,(QSize *)in_RDI);
    }
    else {
      TVar3 = QEvent::type((QEvent *)in_RSI);
      if (TVar3 == ToolTip) {
        memset(local_78,0xaa,0x70);
        QStyleOptionTitleBar::QStyleOptionTitleBar((QStyleOptionTitleBar *)0x62aa78);
        QStyleOption::initFrom(this_00,in_RSI);
        showToolTip((QHelpEvent *)in_RSI,(QWidget *)in_RDI,
                    (QStyleOptionComplex *)
                    CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
        QStyleOptionTitleBar::~QStyleOptionTitleBar
                  ((QStyleOptionTitleBar *)
                   CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      }
    }
  }
  bVar2 = QWidget::event(in_stack_000000b0,in_stack_000000a8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool ControlLabel::event(QEvent *event)
{
    if (event->type() == QEvent::WindowIconChange)
        updateWindowIcon();
    else if (event->type() == QEvent::StyleChange) {
        updateWindowIcon();
        setFixedSize(label.size());
    }
#if QT_CONFIG(tooltip)
    else if (event->type() == QEvent::ToolTip) {
        QStyleOptionTitleBar options;
        options.initFrom(this);
        showToolTip(static_cast<QHelpEvent *>(event), this, options,
                    QStyle::CC_TitleBar, QStyle::SC_TitleBarSysMenu);
    }
#endif
    return QWidget::event(event);
}